

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

bool __thiscall
Assimp::glTF2Importer::CanRead(glTF2Importer *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  bool bVar2;
  string version;
  Asset asset;
  string local_a70;
  long *local_a50;
  long local_a48;
  long local_a40 [2];
  Asset local_a30;
  
  BaseImporter::GetExtension(&local_a70,pFile);
  iVar1 = std::__cxx11::string::compare((char *)&local_a70);
  if (iVar1 == 0) {
    if (pIOHandler == (IOSystem *)0x0) {
      bVar2 = false;
      goto LAB_00645d81;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_a70);
    bVar2 = false;
    if ((pIOHandler == (IOSystem *)0x0) || (iVar1 != 0)) goto LAB_00645d81;
  }
  glTF2::Asset::Asset(&local_a30,pIOHandler);
  iVar1 = std::__cxx11::string::compare((char *)&local_a70);
  glTF2::Asset::Load(&local_a30,pFile,iVar1 == 0);
  local_a50 = local_a40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a50,local_a30.asset.version._M_dataplus._M_p,
             local_a30.asset.version._M_dataplus._M_p + local_a30.asset.version._M_string_length);
  if (local_a48 == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = (char)*local_a50 == '2';
  }
  if (local_a50 != local_a40) {
    operator_delete(local_a50,local_a40[0] + 1);
  }
  glTF2::Asset::~Asset(&local_a30);
LAB_00645d81:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool glTF2Importer::CanRead(const std::string &pFile, IOSystem *pIOHandler, bool /* checkSig */) const {
	const std::string &extension = GetExtension(pFile);

	if (extension != "gltf" && extension != "glb")
		return false;

	if (pIOHandler) {
		glTF2::Asset asset(pIOHandler);
		asset.Load(pFile, extension == "glb");
		std::string version = asset.asset.version;
		return !version.empty() && version[0] == '2';
	}

	return false;
}